

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O2

void __thiscall JAMA::Eigenvalue<double>::tql2(Eigenvalue<double> *this)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double **ppdVar4;
  double *pdVar5;
  uint uVar6;
  pointer pdVar7;
  ulong uVar8;
  pointer pdVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int j;
  ulong uVar17;
  int j_1;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  long local_c8;
  
  uVar6 = this->n;
  pdVar7 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar10 = 1; lVar10 < (int)uVar6; lVar10 = lVar10 + 1) {
    pdVar7[lVar10 + -1] = pdVar7[lVar10];
  }
  pdVar7[(long)(int)uVar6 + -1] = 0.0;
  local_c8 = 0;
  dVar30 = 0.0;
  uVar8 = 0;
  dVar20 = 0.0;
  do {
    pdVar9 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(int)uVar6 <= (long)uVar8) {
      uVar8 = 0;
      uVar12 = 0;
      if (0 < (int)uVar6) {
        uVar12 = (ulong)uVar6;
      }
      uVar13 = 1;
      if (1 < (int)uVar6) {
        uVar13 = uVar6;
      }
      uVar11 = 1;
      for (; uVar8 != uVar13 - 1; uVar8 = uVar8 + 1) {
        uVar16 = uVar8 & 0xffffffff;
        dVar20 = pdVar9[uVar8];
        for (uVar17 = uVar11; (int)uVar17 < (int)uVar6; uVar17 = uVar17 + 1) {
          if (pdVar9[uVar17] < dVar20) {
            uVar16 = uVar17 & 0xffffffff;
            dVar20 = pdVar9[uVar17];
          }
        }
        if (uVar8 != uVar16) {
          pdVar9[(int)uVar16] = pdVar9[uVar8];
          pdVar9[uVar8] = dVar20;
          ppdVar4 = (this->V).data_;
          for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
            pdVar5 = ppdVar4[uVar17];
            dVar20 = pdVar5[uVar8];
            pdVar5[uVar8] = pdVar5[uVar16];
            pdVar5[uVar16] = dVar20;
          }
        }
        uVar11 = uVar11 + 1;
      }
      return;
    }
    uVar12 = (ulong)uVar6;
    dVar19 = pdVar9[uVar8];
    dVar18 = pdVar7[uVar8];
    dVar31 = ABS(dVar18) + ABS(dVar19);
    if (ABS(dVar18) + ABS(dVar19) <= dVar20) {
      dVar31 = dVar20;
    }
    for (uVar11 = uVar8; uVar16 = uVar12, uVar12 != uVar11; uVar11 = uVar11 + 1) {
      if (ABS(pdVar7[uVar11]) <= dVar31 * 2.220446049250313e-16) {
        uVar12 = uVar11;
        uVar16 = uVar11 & 0xffffffff;
        break;
      }
    }
    uVar11 = uVar8 + 1;
    if (uVar8 < uVar16) {
      do {
        pdVar7 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar20 = pdVar7[uVar8];
        dVar18 = (pdVar7[uVar11] - dVar20) / (dVar18 + dVar18);
        dVar19 = hypot(dVar18,1.0);
        pdVar9 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar18 = (double)((ulong)-dVar19 & -(ulong)(dVar18 < 0.0) |
                         ~-(ulong)(dVar18 < 0.0) & (ulong)dVar19) + dVar18;
        dVar19 = pdVar7[uVar8] / dVar18;
        pdVar9[uVar8] = dVar19;
        dVar18 = dVar18 * pdVar7[uVar8];
        pdVar9[uVar11] = dVar18;
        dVar20 = dVar20 - dVar19;
        uVar6 = this->n;
        for (lVar10 = 2; (int)uVar8 + (int)lVar10 < (int)uVar6; lVar10 = lVar10 + 1) {
          *(double *)((long)pdVar9 + lVar10 * 8 + local_c8) =
               *(double *)((long)pdVar9 + lVar10 * 8 + local_c8) - dVar20;
        }
        dVar19 = pdVar9[uVar16];
        dVar2 = pdVar7[uVar11];
        auVar26 = ZEXT816(0x3ff0000000000000);
        uVar17 = (long)(int)uVar12;
        dVar21 = 0.0;
        dVar22 = 1.0;
        dVar23 = 1.0;
        while( true ) {
          dVar29 = dVar22;
          dVar27 = auVar26._8_8_;
          dVar22 = auVar26._0_8_;
          if ((long)uVar17 <= (long)uVar8) break;
          uVar1 = uVar17 - 1;
          dVar23 = dVar22 * pdVar7[uVar1];
          auVar26._0_8_ = hypot(dVar19,pdVar7[uVar1]);
          pdVar7 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7[uVar17] = dVar27 * auVar26._0_8_;
          auVar25._8_8_ = pdVar7[uVar1];
          auVar25._0_8_ = dVar19;
          auVar26._8_8_ = auVar26._0_8_;
          auVar26 = divpd(auVar25,auVar26);
          pdVar9 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar21 = pdVar9[uVar1];
          dVar24 = auVar26._0_8_;
          dVar28 = auVar26._8_8_;
          pdVar9[uVar17] = (dVar23 * dVar24 + dVar28 * dVar21) * dVar28 + dVar19 * dVar22;
          uVar6 = this->n;
          ppdVar4 = (this->V).data_;
          uVar14 = 0;
          if (0 < (int)uVar6) {
            uVar14 = (ulong)uVar6;
          }
          for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
            pdVar5 = ppdVar4[uVar15];
            dVar19 = pdVar5[uVar17 & 0xffffffff];
            dVar3 = pdVar5[uVar1 & 0xffffffff];
            pdVar5[uVar17 & 0xffffffff] = dVar28 * dVar3 + dVar24 * dVar19;
            pdVar5[uVar1 & 0xffffffff] = dVar3 * dVar24 + dVar19 * -dVar28;
          }
          dVar19 = dVar21 * dVar24 + -dVar28 * dVar23;
          uVar17 = uVar1;
          dVar21 = dVar27;
          dVar23 = dVar29;
        }
        dVar30 = dVar30 + dVar20;
        dVar18 = (dVar2 * dVar23 * dVar21 * -dVar27 * pdVar7[uVar8]) / dVar18;
        pdVar7[uVar8] = dVar27 * dVar18;
        (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = dVar22 * dVar18;
        dVar18 = pdVar7[uVar8];
      } while (dVar31 * 2.220446049250313e-16 < ABS(dVar18));
      pdVar9 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar19 = pdVar9[uVar8];
    }
    pdVar9[uVar8] = dVar19 + dVar30;
    pdVar7[uVar8] = 0.0;
    local_c8 = local_c8 + 8;
    uVar8 = uVar11;
    dVar20 = dVar31;
  } while( true );
}

Assistant:

void tql2() {
      //  This is derived from the Algol procedures tql2, by
      //  Bowdler, Martin, Reinsch, and Wilkinson, Handbook for
      //  Auto. Comp., Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      for (int i = 1; i < n; i++) {
        e(i - 1) = e(i);
      }
      e(n - 1) = 0.0;

      Real f    = 0.0;
      Real tst1 = 0.0;
      Real eps  = pow(2.0, -52.0);
      for (int l = 0; l < n; l++) {
        // Find small subdiagonal element

        tst1  = max(tst1, abs(d(l)) + abs(e(l)));
        int m = l;

        // Original while-loop from Java code
        while (m < n) {
          if (abs(e(m)) <= eps * tst1) { break; }
          m++;
        }

        // If m == l, d(l) is an eigenvalue,
        // otherwise, iterate.

        if (m > l) {
          int iter = 0;
          do {
            iter = iter + 1;  // (Could check iteration count here.)

            // Compute implicit shift

            Real g = d(l);
            Real p = (d(l + 1) - g) / (2.0 * e(l));
            Real r = hypot(p, 1.0);
            if (p < 0) { r = -r; }
            d(l)     = e(l) / (p + r);
            d(l + 1) = e(l) * (p + r);
            Real dl1 = d(l + 1);
            Real h   = g - d(l);
            for (int i = l + 2; i < n; i++) {
              d(i) -= h;
            }
            f = f + h;

            // Implicit QL transformation.

            p        = d(m);
            Real c   = 1.0;
            Real c2  = c;
            Real c3  = c;
            Real el1 = e(l + 1);
            Real s   = 0.0;
            Real s2  = 0.0;
            for (int i = m - 1; i >= l; i--) {
              c3       = c2;
              c2       = c;
              s2       = s;
              g        = c * e(i);
              h        = c * p;
              r        = hypot(p, e(i));
              e(i + 1) = s * r;
              s        = e(i) / r;
              c        = p / r;
              p        = c * d(i) - s * g;
              d(i + 1) = h + s * (c * g + s * d(i));

              // Accumulate transformation.

              for (int k = 0; k < n; k++) {
                h           = V(k, i + 1);
                V(k, i + 1) = s * V(k, i) + c * h;
                V(k, i)     = c * V(k, i) - s * h;
              }
            }
            p    = -s * s2 * c3 * el1 * e(l) / dl1;
            e(l) = s * p;
            d(l) = c * p;

            // Check for convergence.

          } while (abs(e(l)) > eps * tst1);
        }
        d(l) = d(l) + f;
        e(l) = 0.0;
      }

      // Sort eigenvalues and corresponding vectors.

      for (int i = 0; i < n - 1; i++) {
        int k  = i;
        Real p = d(i);
        for (int j = i + 1; j < n; j++) {
          if (d(j) < p) {
            k = j;
            p = d(j);
          }
        }
        if (k != i) {
          d(k) = d(i);
          d(i) = p;
          for (int j = 0; j < n; j++) {
            p       = V(j, i);
            V(j, i) = V(j, k);
            V(j, k) = p;
          }
        }
      }
    }